

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::DictVectorizer::MergeFrom(DictVectorizer *this,DictVectorizer *from)

{
  MapCase MVar1;
  LogMessage *other;
  StringVector *this_00;
  StringVector *from_00;
  Int64Vector *this_01;
  Int64Vector *from_01;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  DictVectorizer *local_18;
  DictVectorizer *from_local;
  DictVectorizer *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/DictVectorizer.pb.cc"
               ,0x135);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  MVar1 = Map_case(local_18);
  if (MVar1 != MAP_NOT_SET) {
    if (MVar1 == kStringToIndex) {
      this_00 = _internal_mutable_stringtoindex(this);
      from_00 = _internal_stringtoindex(local_18);
      StringVector::MergeFrom(this_00,from_00);
    }
    else if (MVar1 == kInt64ToIndex) {
      this_01 = _internal_mutable_int64toindex(this);
      from_01 = _internal_int64toindex(local_18);
      Int64Vector::MergeFrom(this_01,from_01);
    }
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void DictVectorizer::MergeFrom(const DictVectorizer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.DictVectorizer)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.Map_case()) {
    case kStringToIndex: {
      _internal_mutable_stringtoindex()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringtoindex());
      break;
    }
    case kInt64ToIndex: {
      _internal_mutable_int64toindex()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64toindex());
      break;
    }
    case MAP_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}